

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall
dxil_spv::SPIRVModule::register_builtin_shader_input(SPIRVModule *this,Id id,BuiltIn builtin)

{
  pointer this_00;
  BuiltIn builtin_local;
  Id id_local;
  SPIRVModule *this_local;
  
  this_00 = std::
            unique_ptr<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
            ::operator->(&this->impl);
  Impl::register_builtin_shader_input(this_00,id,builtin);
  return;
}

Assistant:

void SPIRVModule::register_builtin_shader_input(spv::Id id, spv::BuiltIn builtin)
{
	impl->register_builtin_shader_input(id, builtin);
}